

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cc
# Opt level: O2

bool __thiscall ConfigFile::save(ConfigFile *this,string *path)

{
  char cVar1;
  Stream *pSVar2;
  size_t in_RCX;
  void *__buf;
  allocator<char> local_241;
  undefined1 local_240 [40];
  ofstream file;
  
  std::ofstream::ofstream(&file,(string *)path,_S_trunc);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_240 + 8),"config",&local_241);
    Log::Logger::operator[]((Logger *)local_240,(string *)&Log::Error);
    pSVar2 = Log::Stream::operator<<((Stream *)local_240,"Failed to open config file \'");
    pSVar2 = Log::Stream::operator<<(pSVar2,path);
    Log::Stream::operator<<(pSVar2,"\'");
    Log::Stream::~Stream((Stream *)local_240);
    std::__cxx11::string::~string((string *)(local_240 + 8));
  }
  else {
    write(this,(int)&file,__buf,in_RCX);
  }
  std::ofstream::~ofstream(&file);
  return (bool)cVar1;
}

Assistant:

bool
ConfigFile::save(const std::string &path) {
  std::ofstream file(path, std::ios_base::trunc);
  if (!file.is_open()) {
    Log::Error["config"] << "Failed to open config file '" << path << "'";
    return false;
  }

  return write(&file);
}